

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O0

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
duckdb::BoundParameterExpression::Deserialize(Deserializer *deserializer)

{
  LogicalType *this;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> in_RDI;
  unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
  result;
  shared_ptr<duckdb::BoundParameterData,_true> parameter_data;
  LogicalType return_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> identifier;
  pointer in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff48;
  field_id_t in_stack_ffffffffffffff56;
  Deserializer *in_stack_ffffffffffffff58;
  field_id_t in_stack_ffffffffffffff66;
  Deserializer *in_stack_ffffffffffffff68;
  string local_90 [6];
  field_id_t in_stack_ffffffffffffff76;
  Deserializer *in_stack_ffffffffffffff78;
  shared_ptr<duckdb::BoundParameterData,_true> *in_stack_ffffffffffffff90;
  LogicalType *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  bound_parameter_map_t *in_stack_ffffffffffffffa8;
  BoundParameterExpression *in_stack_ffffffffffffffb0;
  string local_30 [48];
  
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff76,(char *)in_stack_ffffffffffffff68);
  Deserializer::ReadProperty<duckdb::LogicalType>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff56,in_stack_ffffffffffffff48);
  Deserializer::ReadPropertyWithDefault<duckdb::shared_ptr<duckdb::BoundParameterData,true>>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff66,(char *)in_stack_ffffffffffffff58);
  operator_new(0x88);
  this = (LogicalType *)
         Deserializer::
         Get<std::unordered_map<std::__cxx11::string,duckdb::shared_ptr<duckdb::BoundParameterData,true>,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::BoundParameterData,true>>>>&>
                   ((Deserializer *)0xad07ce);
  ::std::__cxx11::string::string(local_90,local_30);
  LogicalType::LogicalType(this,(LogicalType *)in_stack_ffffffffffffff18);
  shared_ptr<duckdb::BoundParameterData,_true>::shared_ptr
            ((shared_ptr<duckdb::BoundParameterData,_true> *)this,
             (shared_ptr<duckdb::BoundParameterData,_true> *)in_stack_ffffffffffffff18);
  BoundParameterExpression
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  unique_ptr<duckdb::BoundParameterExpression,std::default_delete<duckdb::BoundParameterExpression>,true>
  ::unique_ptr<std::default_delete<duckdb::BoundParameterExpression>,void>
            ((unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
              *)this,in_stack_ffffffffffffff18);
  shared_ptr<duckdb::BoundParameterData,_true>::~shared_ptr
            ((shared_ptr<duckdb::BoundParameterData,_true> *)0xad084b);
  LogicalType::~LogicalType((LogicalType *)0xad0855);
  ::std::__cxx11::string::~string(local_90);
  unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
  unique_ptr<duckdb::BoundParameterExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)this,
             (unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>_>
              *)in_stack_ffffffffffffff18);
  unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
                 *)0xad0878);
  shared_ptr<duckdb::BoundParameterData,_true>::~shared_ptr
            ((shared_ptr<duckdb::BoundParameterData,_true> *)0xad0885);
  LogicalType::~LogicalType((LogicalType *)0xad0892);
  ::std::__cxx11::string::~string(local_30);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<Expression> BoundParameterExpression::Deserialize(Deserializer &deserializer) {
	auto identifier = deserializer.ReadPropertyWithDefault<string>(200, "identifier");
	auto return_type = deserializer.ReadProperty<LogicalType>(201, "return_type");
	auto parameter_data = deserializer.ReadPropertyWithDefault<shared_ptr<BoundParameterData>>(202, "parameter_data");
	auto result = duckdb::unique_ptr<BoundParameterExpression>(new BoundParameterExpression(deserializer.Get<bound_parameter_map_t &>(), std::move(identifier), std::move(return_type), std::move(parameter_data)));
	return std::move(result);
}